

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_history.cpp
# Opt level: O3

void __thiscall undo::UndoHistory::undo(UndoHistory *this)

{
  UndoState *pUVar1;
  UndoState *new_state;
  
  pUVar1 = this->m_cur;
  if (pUVar1 == (UndoState *)0x0) {
    __assert_fail("m_cur",
                  "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/undo_history.cpp",
                  0x2d,"void undo::UndoHistory::undo()");
  }
  new_state = pUVar1->m_prev;
  if (pUVar1 == this->m_first) {
    if (new_state == (UndoState *)0x0) {
      new_state = (UndoState *)0x0;
      goto LAB_0010190d;
    }
  }
  else if (new_state != (UndoState *)0x0) {
LAB_0010190d:
    moveTo(this,new_state);
    return;
  }
  __assert_fail("(m_cur != m_first && m_cur->m_prev) || (m_cur == m_first && !m_cur->m_prev)",
                "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/undo_history.cpp",
                0x33,"void undo::UndoHistory::undo()");
}

Assistant:

void UndoHistory::undo()
{
  assert(m_cur);
  if (!m_cur)
    return;

  assert(
    (m_cur != m_first && m_cur->m_prev) ||
    (m_cur == m_first && !m_cur->m_prev));

  moveTo(m_cur->m_prev);
}